

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ParameterSymbol::ParameterSymbol
          (ParameterSymbol *this,string_view name,SourceLocation loc,bool isLocal,bool isPort)

{
  string_view name_00;
  bitmask<slang::ast::DeclaredTypeFlags> flags;
  byte bVar1;
  SourceLocation in_RCX;
  char *in_RDX;
  size_t in_RSI;
  Symbol *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  DeclaredTypeFlags in_stack_ffffffffffffff8c;
  DeclaredTypeFlags in_stack_ffffffffffffff90;
  ValueSymbol *in_stack_ffffffffffffffb0;
  SourceLocation location;
  
  bVar1 = (byte)in_R8D;
  location = in_RCX;
  ast::operator|(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xffffffffffffffb4,
             AllowUnboundedLiteral);
  flags = bitmask<slang::ast::DeclaredTypeFlags>::operator|
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_RCX,
                     (bitmask<slang::ast::DeclaredTypeFlags> *)
                     CONCAT44(in_R8D,in_stack_ffffffffffffff90));
  name_00._M_str = in_RDX;
  name_00._M_len = in_RSI;
  ValueSymbol::ValueSymbol
            (in_stack_ffffffffffffffb0,(SymbolKind)((ulong)in_RDI >> 0x20),name_00,location,flags);
  ParameterSymbolBase::ParameterSymbolBase
            ((ParameterSymbolBase *)&in_RDI[5].name._M_str,in_RDI,(bool)(bVar1 & 1),
             (bool)(in_R9B & 1));
  in_RDI[5].nextInScope = (Symbol *)0x0;
  *(undefined1 *)&in_RDI[5].indexInScope = 0;
  *(byte *)((long)&in_RDI[5].indexInScope + 1) = 0;
  *(byte *)((long)&in_RDI[5].indexInScope + 2) = 0;
  *(byte *)((long)&in_RDI[5].indexInScope + 3) = 0;
  in_RDI[5].field_0x34 = 0;
  return;
}

Assistant:

ParameterSymbol::ParameterSymbol(std::string_view name, SourceLocation loc, bool isLocal,
                                 bool isPort) :
    ValueSymbol(SymbolKind::Parameter, name, loc,
                DeclaredTypeFlags::InferImplicit | DeclaredTypeFlags::InitializerCantSeeParent |
                    DeclaredTypeFlags::AllowUnboundedLiteral),
    ParameterSymbolBase(*this, isLocal, isPort) {
}